

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O2

SmallNormalHeapBlockT<SmallAllocationBlockAttributes> * __thiscall
Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::CreateHeapBlock
          (HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *this,
          Recycler *recycler)

{
  uint32 *puVar1;
  HeapInfo *pHVar2;
  BOOL BVar3;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *this_00;
  
  this_00 = &GetUnusedHeapBlock(this)->super_SmallHeapBlockT<SmallAllocationBlockAttributes>;
  if (this_00 != (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    BVar3 = SmallHeapBlockT<SmallAllocationBlockAttributes>::ReassignPages(this_00,recycler);
    if (BVar3 != 0) {
      pHVar2 = (this->super_HeapBucket).heapInfo;
      this_00->next =
           &pHVar2->newNormalHeapBlockList->super_SmallHeapBlockT<SmallAllocationBlockAttributes>;
      pHVar2->newNormalHeapBlockList = (SmallNormalHeapBlock *)this_00;
      LOCK();
      puVar1 = &(this->super_HeapBucket).newHeapBlockCount;
      *puVar1 = *puVar1 + 1;
      UNLOCK();
      return (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)this_00;
    }
    FreeHeapBlock(this,(SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)this_00);
  }
  return (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
}

Assistant:

TBlockType *
HeapBucketT<TBlockType>::CreateHeapBlock(Recycler * recycler)
{
    FAULTINJECT_MEMORY_NOTHROW(_u("HeapBlock"), sizeof(TBlockType));

    // Add a new heap block
    TBlockType * heapBlock = GetUnusedHeapBlock();
    if (heapBlock == nullptr)
    {
        return nullptr;
    }

    if (!heapBlock->ReassignPages(recycler))
    {
        FreeHeapBlock(heapBlock);
        return nullptr;
    }

    // Add it to head of heap block list so we will keep track of the block
    this->heapInfo->AppendNewHeapBlock(heapBlock, this);
#if defined(RECYCLER_SLOW_CHECK_ENABLED) || ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
#if ENABLE_CONCURRENT_GC
    ::InterlockedIncrement(&this->newHeapBlockCount);
#else
    this->heapBlockCount++;
#endif
#endif
    return heapBlock;
}